

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildFile::BuildFile
          (BuildFile *this,StringRef mainFilename,BuildFileDelegate *delegate)

{
  string *__return_storage_ptr__;
  StringRef local_38;
  
  __return_storage_ptr__ = (string *)operator_new(0xd0);
  local_38.Data = mainFilename.Data;
  local_38.Length = mainFilename.Length;
  llvm::StringRef::str_abi_cxx11_(__return_storage_ptr__,&local_38);
  __return_storage_ptr__[1]._M_dataplus._M_p = (pointer)delegate;
  __return_storage_ptr__[1]._M_string_length = 0;
  __return_storage_ptr__[1].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&__return_storage_ptr__[1].field_2 + 8) = 0x1000000000;
  __return_storage_ptr__[2]._M_string_length = 0;
  __return_storage_ptr__[2].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&__return_storage_ptr__[2].field_2 + 8) = 0x1000000000;
  __return_storage_ptr__[3]._M_string_length =
       (size_type)((long)&__return_storage_ptr__[3].field_2 + 8);
  __return_storage_ptr__[3].field_2._M_allocated_capacity = 0;
  __return_storage_ptr__[3].field_2._M_local_buf[8] = '\0';
  __return_storage_ptr__[4]._M_string_length = 0;
  __return_storage_ptr__[4].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&__return_storage_ptr__[4].field_2 + 8) = 0x1000000000;
  __return_storage_ptr__[5]._M_string_length = 0;
  __return_storage_ptr__[5].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&__return_storage_ptr__[5].field_2 + 8) = 0x1000000000;
  *(undefined1 *)&__return_storage_ptr__[6]._M_string_length = 0;
  *(undefined4 *)((long)&__return_storage_ptr__[6]._M_string_length + 4) = 0;
  this->impl = __return_storage_ptr__;
  return;
}

Assistant:

BuildFile::BuildFile(StringRef mainFilename,
                     BuildFileDelegate& delegate)
  : impl(new BuildFileImpl(*this, mainFilename, delegate))
{
}